

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::ui_switch_state(Application *this)

{
  bool bVar1;
  PathTracerThread *in_RDI;
  LoaderThread *in_stack_00000058;
  
  std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11e4ef);
  bVar1 = PathTracerThread::IsRunning(in_RDI);
  if (bVar1) {
    *(undefined4 *)((long)&in_RDI[1].m_pause_semaphore.m_mtx.super___mutex_base._M_mutex + 0x18) = 2
    ;
  }
  else {
    std::__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11e522);
    bVar1 = LoaderThread::IsRunning((LoaderThread *)0x11e52a);
    if (bVar1) {
      *(undefined4 *)((long)&in_RDI[1].m_pause_semaphore.m_mtx.super___mutex_base._M_mutex + 0x18) =
           3;
      std::__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<LoaderThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11e54b);
      bVar1 = LoaderThread::TryJoin(in_stack_00000058);
      if (bVar1) {
        std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11e56a
                  );
        bVar1 = Octree::Empty((Octree *)0x11e572);
        *(uint *)((long)&in_RDI[1].m_pause_semaphore.m_mtx.super___mutex_base._M_mutex + 0x18) =
             (uint)!bVar1;
      }
    }
    else {
      std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11e5a1);
      bVar1 = Octree::Empty((Octree *)0x11e5a9);
      if (bVar1) {
        *(undefined4 *)((long)&in_RDI[1].m_pause_semaphore.m_mtx.super___mutex_base._M_mutex + 0x18)
             = 0;
      }
      else {
        *(undefined4 *)((long)&in_RDI[1].m_pause_semaphore.m_mtx.super___mutex_base._M_mutex + 0x18)
             = 1;
      }
    }
  }
  return;
}

Assistant:

void Application::ui_switch_state() {
	if (m_path_tracer_thread->IsRunning()) {
		m_ui_state = UIStates::kPathTracing;
	} else if (m_loader_thread->IsRunning()) {
		m_ui_state = UIStates::kLoading;

		if (m_loader_thread->TryJoin()) {
			m_ui_state = m_octree->Empty() ? UIStates::kEmpty : UIStates::kOctreeTracer;
		}
	} else if (m_octree->Empty())
		m_ui_state = UIStates::kEmpty;
	else {
		m_ui_state = UIStates::kOctreeTracer;
	}
}